

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void __thiscall
slang::ast::Scope::insertMember
          (Scope *this,Symbol *member,Symbol *at,bool isElaborating,bool incrementIndex)

{
  char *pcVar1;
  Symbol *pSVar2;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  uint uVar3;
  bool bVar4;
  SymbolIndex SVar5;
  uint uVar6;
  uint64_t hash;
  byte bVar7;
  Symbol **ppSVar8;
  ulong pos0;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  basic_string_view<char,_std::char_traits<char>_> *pbVar13;
  undefined1 auVar14 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  byte bVar30;
  try_emplace_args_t local_b1;
  basic_string_view<char,_std::char_traits<char>_> *local_b0;
  Symbol *member_local;
  long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uint64_t local_78;
  ulong local_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  locator local_48;
  
  if (at == (Symbol *)0x0) {
    ppSVar8 = &this->firstMember;
    SVar5 = 1;
  }
  else {
    SVar5 = (uint)incrementIndex + at->indexInScope;
    ppSVar8 = &at->nextInScope;
  }
  pSVar2 = *ppSVar8;
  *ppSVar8 = member;
  member->indexInScope = SVar5;
  member->nextInScope = pSVar2;
  member->parentScope = this;
  if (pSVar2 == (Symbol *)0x0) {
    this->lastMember = member;
  }
  if (((member->name)._M_len != 0) &&
     ((uVar6 = member->kind - Port, 0x3b < uVar6 ||
      ((0x800000400000203U >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) {
    pbVar13 = &member->name;
    this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this->nameMap;
    member_local = member;
    hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     (this_00,pbVar13);
    pos0 = hash >> ((byte)*this_00 & 0x3f);
    lVar10 = (hash & 0xff) * 4;
    cVar15 = (&UNK_0042856c)[lVar10];
    cVar16 = (&UNK_0042856d)[lVar10];
    cVar17 = (&UNK_0042856e)[lVar10];
    bVar18 = (&UNK_0042856f)[lVar10];
    uVar12 = (ulong)((uint)hash & 7);
    uVar9 = 0;
    uVar11 = pos0;
    cVar19 = cVar15;
    cVar20 = cVar16;
    cVar21 = cVar17;
    bVar22 = bVar18;
    cVar23 = cVar15;
    cVar24 = cVar16;
    cVar25 = cVar17;
    bVar26 = bVar18;
    cVar27 = cVar15;
    cVar28 = cVar16;
    cVar29 = cVar17;
    bVar30 = bVar18;
    do {
      pcVar1 = (char *)(*(long *)(this_00 + 0x10) + uVar11 * 0x10);
      local_58 = *pcVar1;
      cStack_57 = pcVar1[1];
      cStack_56 = pcVar1[2];
      bStack_55 = pcVar1[3];
      cStack_54 = pcVar1[4];
      cStack_53 = pcVar1[5];
      cStack_52 = pcVar1[6];
      bStack_51 = pcVar1[7];
      cStack_50 = pcVar1[8];
      cStack_4f = pcVar1[9];
      cStack_4e = pcVar1[10];
      bStack_4d = pcVar1[0xb];
      cStack_4c = pcVar1[0xc];
      cStack_4b = pcVar1[0xd];
      cStack_4a = pcVar1[0xe];
      bVar7 = pcVar1[0xf];
      auVar14[0] = -(local_58 == cVar15);
      auVar14[1] = -(cStack_57 == cVar16);
      auVar14[2] = -(cStack_56 == cVar17);
      auVar14[3] = -(bStack_55 == bVar18);
      auVar14[4] = -(cStack_54 == cVar19);
      auVar14[5] = -(cStack_53 == cVar20);
      auVar14[6] = -(cStack_52 == cVar21);
      auVar14[7] = -(bStack_51 == bVar22);
      auVar14[8] = -(cStack_50 == cVar23);
      auVar14[9] = -(cStack_4f == cVar24);
      auVar14[10] = -(cStack_4e == cVar25);
      auVar14[0xb] = -(bStack_4d == bVar26);
      auVar14[0xc] = -(cStack_4c == cVar27);
      auVar14[0xd] = -(cStack_4b == cVar28);
      auVar14[0xe] = -(cStack_4a == cVar29);
      auVar14[0xf] = -(bVar7 == bVar30);
      uVar6 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      bStack_49 = bVar7;
      if (uVar6 != 0) {
        local_a0 = *(long *)(this_00 + 0x10) + uVar11 * 0x10;
        lVar10 = *(long *)(this_00 + 0x18);
        local_b0 = pbVar13;
        local_98 = uVar11;
        local_90 = uVar9;
        local_88 = uVar12;
        local_80 = pos0;
        local_78 = hash;
        local_68 = cVar15;
        cStack_67 = cVar16;
        cStack_66 = cVar17;
        bStack_65 = bVar18;
        cStack_64 = cVar19;
        cStack_63 = cVar20;
        cStack_62 = cVar21;
        bStack_61 = bVar22;
        cStack_60 = cVar23;
        cStack_5f = cVar24;
        cStack_5e = cVar25;
        bStack_5d = bVar26;
        cStack_5c = cVar27;
        cStack_5b = cVar28;
        cStack_5a = cVar29;
        bStack_59 = bVar30;
        do {
          local_70 = (ulong)uVar6;
          uVar3 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          pbVar13 = (basic_string_view<char,_std::char_traits<char>_> *)
                    ((ulong)uVar3 * 0x18 + lVar10 + uVar11 * 0x168);
          bVar4 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             this_00,local_b0,pbVar13);
          if (bVar4) {
            handleNameConflict(this,member,(Symbol **)(pbVar13 + 1),isElaborating);
            return;
          }
          uVar6 = (uint)local_70 - 1 & (uint)local_70;
        } while (uVar6 != 0);
        bVar7 = *(byte *)(local_a0 + 0xf);
        hash = local_78;
        pos0 = local_80;
        uVar9 = local_90;
        uVar11 = local_98;
        uVar12 = local_88;
        pbVar13 = local_b0;
        cVar15 = local_68;
        cVar16 = cStack_67;
        cVar17 = cStack_66;
        bVar18 = bStack_65;
        cVar19 = cStack_64;
        cVar20 = cStack_63;
        cVar21 = cStack_62;
        bVar22 = bStack_61;
        cVar23 = cStack_60;
        cVar24 = cStack_5f;
        cVar25 = cStack_5e;
        bVar26 = bStack_5d;
        cVar27 = cStack_5c;
        cVar28 = cStack_5b;
        cVar29 = cStack_5a;
        bVar30 = bStack_59;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar12] & bVar7) == 0) break;
      lVar10 = uVar11 + uVar9;
      uVar9 = uVar9 + 1;
      uVar11 = lVar10 + 1U & *(ulong *)(this_00 + 8);
    } while (uVar9 <= *(ulong *)(this_00 + 8));
    if (*(ulong *)(this_00 + 0x28) < *(ulong *)(this_00 + 0x20)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                  *)this_00,pos0,hash,&local_b1,pbVar13,&member_local);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                  *)this_00,hash,&local_b1,pbVar13,&member_local);
    }
  }
  return;
}

Assistant:

void Scope::insertMember(const Symbol* member, const Symbol* at, bool isElaborating,
                         bool incrementIndex) const {
    SLANG_ASSERT(!member->parentScope);
    SLANG_ASSERT(!member->nextInScope);

    if (!at) {
        member->indexInScope = SymbolIndex{1};
        member->nextInScope = std::exchange(firstMember, member);
    }
    else {
        member->indexInScope = at->indexInScope + (incrementIndex ? 1 : 0);
        member->nextInScope = std::exchange(at->nextInScope, member);
    }

    member->parentScope = this;
    if (!member->nextInScope)
        lastMember = member;

    // Add to the name map if the symbol has a name and can be looked up
    // by name in the default namespace.
    if (!member->name.empty() && canLookupByName(member->kind)) {
        auto pair = nameMap->emplace(member->name, member);
        if (!pair.second)
            handleNameConflict(*member, pair.first->second, isElaborating);
    }
}